

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

void __thiscall unit_test::main(unit_test *this,string *param_1)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  undefined8 uVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  int iVar12;
  string long_msg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  env;
  _Rb_tree_node_base local_1a0 [11];
  
  cppcms::application::response();
  cppcms::http::response::set_plain_text_header();
  iVar3 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar3);
  bVar2 = is_async;
  cVar1 = cppcms::application::is_asynchronous();
  if (bVar2 != (bool)cVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&env);
    poVar5 = std::operator<<((ostream *)&env,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/proto_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x20);
    std::operator<<(poVar5," is_async == is_asynchronous()");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&long_msg);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = cppcms::application::is_asynchronous();
  cppcms::application::response();
  iVar3 = cppcms::http::response::io_mode();
  if (cVar1 == '\0') {
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&env);
      poVar5 = std::operator<<((ostream *)&env,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/proto_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x22);
      std::operator<<(poVar5," response().io_mode() == cppcms::http::response::normal");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&long_msg);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar7 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar7,1);
  }
  else if (iVar3 != 3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&env);
    poVar5 = std::operator<<((ostream *)&env,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/proto_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x26);
    std::operator<<(poVar5," response().io_mode() == cppcms::http::response::asynchronous");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&long_msg);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (is_nonblocking == true) {
    bVar2 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar2);
  }
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_();
  cppcms::application::response();
  poVar5 = (ostream *)cppcms::http::response::out();
  iVar3 = 1;
  for (p_Var9 = local_1a0[0]._M_left; p_Var9 != local_1a0;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    poVar8 = std::operator<<(poVar5,(string *)(p_Var9 + 1));
    poVar8 = std::operator<<(poVar8,':');
    poVar8 = std::operator<<(poVar8,(string *)(p_Var9 + 2));
    std::operator<<(poVar8,'\n');
  }
  std::operator<<(poVar5,'\n');
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)&long_msg);
  iVar4 = atoi(long_msg._M_dataplus._M_p);
  iVar12 = 0;
  if (0 < iVar4) {
    iVar12 = iVar4;
  }
  for (; iVar3 - iVar12 != 1; iVar3 = iVar3 + 1) {
    poVar8 = std::operator<<(poVar5,0x30);
    *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 5;
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar3);
    std::operator<<(poVar8,'\n');
  }
  cppcms::application::request();
  lVar10 = cppcms::http::request::post_abi_cxx11_();
  for (p_Var11 = *(_Rb_tree_node_base **)(lVar10 + 0x18);
      p_Var11 != (_Rb_tree_node_base *)(lVar10 + 8);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    poVar8 = std::operator<<(poVar5,(string *)(p_Var11 + 1));
    poVar8 = std::operator<<(poVar8,'=');
    poVar8 = std::operator<<(poVar8,(string *)(p_Var11 + 2));
    std::operator<<(poVar8,'\n');
  }
  std::__cxx11::string::~string((string *)&long_msg);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&env);
  return;
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		response().set_plain_text_header();
		response().setbuf(64);
		TEST(is_async == is_asynchronous());
		if(!is_asynchronous()) {
			TEST(response().io_mode() == cppcms::http::response::normal);
			response().io_mode(cppcms::http::response::nogzip);
		}
		else {
			TEST(response().io_mode() == cppcms::http::response::asynchronous);
		}
		if(is_nonblocking) {
			response().full_asynchronous_buffering(false);
		}
		std::map<std::string,std::string> env=request().getenv();
		std::ostream &out = response().out();
		for(std::map<std::string,std::string>::const_iterator p=env.begin();p!=env.end();++p) {
			out << p->first <<':'<<p->second << '\n';
		}
		out << '\n';
		std::string long_msg = request().getenv("LONG_MESSAGE");
		int lmsg = atoi(long_msg.c_str());
		for(int i=1;i<=lmsg;i++) {
			out << std::setfill('0') << std::setw(5) << i << '\n';
		}
		typedef cppcms::http::request::form_type form_type;
		form_type const &form=request().post();
		for(form_type::const_iterator p=form.begin();p!=form.end();++p) {
			out << p->first <<'='<<p->second << '\n';
		}
	}